

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tournser.cpp
# Opt level: O0

void __thiscall
delta_complex_t::delta_complex_t(delta_complex_t *this,vector<int,_std::allocator<int>_> *vertices)

{
  ulong uVar1;
  size_type sVar2;
  reference this_00;
  reference pvVar3;
  reference this_01;
  clique_t local_180;
  delta_complex_cell_t local_110;
  int local_28;
  int i;
  vector<int,_std::allocator<int>_> *local_18;
  vector<int,_std::allocator<int>_> *vertices_local;
  delta_complex_t *this_local;
  
  local_18 = vertices;
  vertices_local = (vector<int,_std::allocator<int>_> *)this;
  std::
  vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
  ::vector(&this->cells);
  std::
  vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
  ::vector(&this->cliques);
  add_dimension(this);
  local_28 = 0;
  while( true ) {
    uVar1 = (ulong)local_28;
    sVar2 = std::vector<int,_std::allocator<int>_>::size(vertices);
    if (sVar2 <= uVar1) break;
    this_00 = std::
              vector<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>,_std::allocator<std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>_>_>
              ::operator[](&this->cells,0);
    sVar2 = (size_type)local_28;
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](vertices,sVar2);
    delta_complex_cell_t::delta_complex_cell_t(&local_110,sVar2,(float)*pvVar3);
    std::vector<delta_complex_cell_t,_std::allocator<delta_complex_cell_t>_>::push_back
              (this_00,&local_110);
    delta_complex_cell_t::~delta_complex_cell_t(&local_110);
    this_01 = std::
              vector<std::vector<clique_t,_std::allocator<clique_t>_>,_std::allocator<std::vector<clique_t,_std::allocator<clique_t>_>_>_>
              ::operator[](&this->cliques,0);
    clique_t::clique_t(&local_180,(long)local_28);
    std::vector<clique_t,_std::allocator<clique_t>_>::push_back(this_01,&local_180);
    clique_t::~clique_t(&local_180);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

delta_complex_t(std::vector<int> vertices){
		add_dimension();
		for( int i = 0; i < vertices.size(); i++ ){
            cells[0].push_back(delta_complex_cell_t(i,vertices[i]));
			cliques[0].push_back(clique_t(i));
        }
	}